

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void rw::cameraSync(ObjectWithFrame *obj)

{
  void **dst;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  LLLink *pLVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar11;
  undefined4 uVar20;
  Matrix *pMVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  undefined1 auVar25 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  Matrix inv;
  Matrix local_98;
  Matrix local_58;
  
  pMVar21 = Frame::getLTM((Frame *)(obj->object).parent);
  Matrix::invertOrthonormal(&local_58,pMVar21);
  local_58.right.x = (float32)-(float)local_58.right.x;
  local_58.up.x = (float32)-(float)local_58.up.x;
  local_58.at.x = (float32)-(float)local_58.at.x;
  local_58.pos.x = (float32)-(float)local_58.pos.x;
  pLVar10 = obj[1].inFrame.next;
  fVar26 = SUB84(pLVar10,0);
  fVar30 = (float)((ulong)pLVar10 >> 0x20);
  auVar25._4_4_ = fVar30 + fVar30;
  auVar25._0_4_ = fVar26 + fVar26;
  auVar25._8_8_ = 0;
  auVar25 = divps(_DAT_00134da0,auVar25);
  local_98.right.x = auVar25._0_4_;
  fVar30 = auVar25._4_4_;
  local_98.right.y = 0.0;
  local_98.right.z = 0.0;
  local_98.flags = 0;
  local_98.up.x = 0.0;
  local_98.up.y = (float32)-fVar30;
  local_98.up.z = 0.0;
  dst = &obj[2].object.parent;
  fVar26 = *(float *)&obj[1].inFrame.prev;
  if (*(int *)&obj[2].object.field_0x4 == 1) {
    local_98.pos.z = 0.0;
    local_98.pos.x = (float32)((float)local_98.right.x * -fVar26);
    local_98.pos.y = (float32)(fVar30 * *(float *)((long)&obj[1].inFrame.prev + 4));
    local_98.at.y = (float32)(0.5 - (float)local_98.pos.y);
    local_98.at.x = (float32)(0.5 - (float)local_98.pos.x);
    local_98.at.z = 1.0;
    Matrix::optimize(&local_98,(Tolerance *)0x0);
    Matrix::mult((Matrix *)dst,&local_58,&local_98);
    pMVar21 = Frame::getLTM((Frame *)(obj->object).parent);
    fVar26 = *(float *)&obj[1].inFrame.next;
    fVar30 = *(float *)((long)&obj[1].inFrame.next + 4);
    fVar28 = (float)(pMVar21->up).z * fVar30;
    fVar27 = (float)(pMVar21->right).z * fVar26;
    fVar24 = (float)(pMVar21->at).z;
    uVar1 = (pMVar21->right).x;
    uVar12 = (pMVar21->right).y;
    uVar2 = (pMVar21->up).x;
    uVar13 = (pMVar21->up).y;
    fVar29 = (float)uVar2 * fVar30;
    fVar30 = (float)uVar13 * fVar30;
    uVar3 = (pMVar21->at).x;
    uVar14 = (pMVar21->at).y;
    fVar23 = fVar26 * (float)uVar1;
    fVar26 = fVar26 * (float)uVar12;
    fVar31 = (float)uVar3 + fVar29 + fVar23;
    obj[7].object.type = SUB41(fVar31,0);
    obj[7].object.subType = (char)((uint)fVar31 >> 8);
    obj[7].object.flags = (char)((uint)fVar31 >> 0x10);
    obj[7].object.privateFlags = (char)((uint)fVar31 >> 0x18);
    *(float *)&obj[7].object.field_0x4 = (float)uVar14 + fVar30 + fVar26;
    *(float *)&obj[7].object.parent = fVar24 + fVar28 + fVar27;
    fVar24 = (float)(pMVar21->at).z;
    uVar4 = (pMVar21->at).x;
    uVar15 = (pMVar21->at).y;
    *(ulong *)((long)&obj[7].object.parent + 4) =
         CONCAT44(((float)uVar15 + fVar30) - fVar26,((float)uVar4 + fVar29) - fVar23);
    *(float *)((long)&obj[7].inFrame.next + 4) = (fVar24 + fVar28) - fVar27;
    fVar24 = (float)(pMVar21->at).z;
    uVar5 = (pMVar21->at).x;
    uVar16 = (pMVar21->at).y;
    obj[7].inFrame.prev =
         (LLLink *)CONCAT44(((float)uVar16 - fVar30) - fVar26,((float)uVar5 - fVar29) - fVar23);
    *(float *)&obj[7].syncCB = (fVar24 - fVar28) - fVar27;
    fVar24 = (float)(pMVar21->at).z;
    uVar6 = (pMVar21->at).x;
    uVar17 = (pMVar21->at).y;
    *(ulong *)((long)&obj[7].syncCB + 4) =
         CONCAT44(((float)uVar17 - fVar30) + fVar26,((float)uVar6 - fVar29) + fVar23);
    *(float *)&obj[8].object.field_0x4 = (fVar24 - fVar28) + fVar27;
    fVar26 = *(float *)&obj[1].inFrame.prev;
    fVar30 = *(float *)((long)&obj[1].inFrame.prev + 4);
    uVar7 = (pMVar21->right).x;
    uVar18 = (pMVar21->right).y;
    uVar8 = (pMVar21->up).x;
    uVar19 = (pMVar21->up).y;
    fVar24 = fVar30 * (float)uVar8 - fVar26 * (float)uVar7;
    fVar23 = fVar30 * (float)uVar19 - fVar26 * (float)uVar18;
    fVar27 = (float)(pMVar21->up).z * fVar30 - fVar26 * (float)(pMVar21->right).z;
    fVar26 = *(float *)&obj[1].syncCB;
    fVar30 = *(float *)((long)&obj[1].syncCB + 4);
    lVar22 = -0x30;
    do {
      fVar28 = *(float *)((long)&obj[8].inFrame.next + lVar22) - fVar27;
      fVar29 = (float)(pMVar21->pos).z + fVar27;
      uVar11 = *(undefined8 *)((long)&obj[8].object.parent + lVar22);
      fVar31 = (float)uVar11 - fVar24;
      fVar32 = (float)((ulong)uVar11 >> 0x20) - fVar23;
      uVar9 = (pMVar21->pos).x;
      uVar20 = (pMVar21->pos).y;
      fVar33 = (float)uVar9 + fVar24;
      fVar34 = (float)uVar20 + fVar23;
      *(ulong *)((long)&obj[8].object.parent + lVar22) =
           CONCAT44(fVar26 * fVar32 + fVar34,fVar26 * fVar31 + fVar33);
      *(float *)((long)&obj[8].inFrame.next + lVar22) = fVar26 * fVar28 + fVar29;
      *(ulong *)((long)&obj[9].inFrame.next + lVar22) =
           CONCAT44(fVar32 * fVar30 + fVar34,fVar31 * fVar30 + fVar33);
      *(float *)((long)&obj[9].inFrame.prev + lVar22) = fVar28 * fVar30 + fVar29;
      lVar22 = lVar22 + 0xc;
    } while (lVar22 != 0);
  }
  else {
    local_98.at.x = (float32)((float)local_98.right.x * fVar26);
    local_98.at.y = (float32)(fVar30 * -*(float *)((long)&obj[1].inFrame.prev + 4));
    local_98.at.z = 1.0;
    local_98.pos.y = (float32)(0.5 - (float)local_98.at.y);
    local_98.pos.x = (float32)(0.5 - (float)local_98.at.x);
    local_98.pos.z = 0.0;
    Matrix::optimize(&local_98,(Tolerance *)0x0);
    Matrix::mult((Matrix *)dst,&local_58,&local_98);
    pMVar21 = Frame::getLTM((Frame *)(obj->object).parent);
    fVar26 = *(float *)&obj[1].syncCB;
    fVar30 = *(float *)((long)&obj[1].syncCB + 4);
    pLVar10 = obj[1].inFrame.next;
    fVar24 = SUB84(pLVar10,0);
    fVar23 = (float)((ulong)pLVar10 >> 0x20);
    pLVar10 = obj[1].inFrame.prev;
    fVar28 = SUB84(pLVar10,0);
    fVar27 = -(1.0 - fVar26) * fVar28;
    fVar31 = (float)((ulong)pLVar10 >> 0x20);
    fVar29 = (1.0 - fVar26) * fVar31;
    fVar32 = fVar27 + fVar24;
    fVar33 = fVar29 + fVar23;
    obj[7].object.type = SUB41(fVar32,0);
    obj[7].object.subType = (char)((uint)fVar32 >> 8);
    obj[7].object.flags = (char)((uint)fVar32 >> 0x10);
    obj[7].object.privateFlags = (char)((uint)fVar32 >> 0x18);
    *(float *)&obj[7].object.field_0x4 = fVar33;
    *(float *)&obj[7].object.parent = fVar26;
    *(float *)&obj[7].inFrame.next = fVar33;
    *(float *)((long)&obj[7].inFrame.next + 4) = fVar26;
    fVar27 = fVar27 - fVar24;
    fVar29 = fVar29 - fVar23;
    *(float *)((long)&obj[7].object.parent + 4) = fVar27;
    obj[7].inFrame.prev = (LLLink *)CONCAT44(fVar29,fVar27);
    *(float *)&obj[7].syncCB = fVar26;
    *(float *)((long)&obj[7].syncCB + 4) = fVar32;
    *(float *)&obj[8].object = fVar29;
    *(float *)&obj[8].object.field_0x4 = fVar26;
    fVar28 = -(1.0 - fVar30) * fVar28;
    fVar31 = (1.0 - fVar30) * fVar31;
    fVar26 = fVar24 + fVar28;
    fVar27 = fVar23 + fVar31;
    obj[8].object.parent = (void *)CONCAT44(fVar27,fVar26);
    *(float *)&obj[8].inFrame.next = fVar30;
    *(float *)&obj[8].inFrame.prev = fVar27;
    *(float *)((long)&obj[8].inFrame.prev + 4) = fVar30;
    fVar28 = fVar28 - fVar24;
    fVar31 = fVar31 - fVar23;
    *(float *)((long)&obj[8].inFrame.next + 4) = fVar28;
    obj[8].syncCB = (Sync)CONCAT44(fVar31,fVar28);
    *(float *)&obj[9].object = fVar30;
    *(float *)&obj[9].object.field_0x4 = fVar26;
    *(float *)&obj[9].object.parent = fVar31;
    *(float *)((long)&obj[9].object.parent + 4) = fVar30;
    V3d::transformPoints((V3d *)(obj + 7),(V3d *)(obj + 7),8,pMVar21);
  }
  buildPlanes((Camera *)obj);
  BBox::calculate((BBox *)&obj[9].inFrame,(V3d *)(obj + 7),8);
  return;
}

Assistant:

static void
cameraSync(ObjectWithFrame *obj)
{
	/*
	 * RW projection matrix looks like this:
	 *       (cf. Camera View Matrix white paper)
	 * w = viewWindow width
	 * h = viewWindow height
	 * o = view offset
	 *
	 * perspective:
	 * 1/2w       0    ox/2w + 1/2   -ox/2w
	 *    0   -1/2h   -oy/2h + 1/2    oy/2h
	 *    0       0              1        0
	 *    0       0              1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w + 1/2
	 *    0   -1/2h   -oy/2h    oy/2h + 1/2
	 *    0       0        1              0
	 *    0       0        0              1
	 *
	 * The view matrix transforms from world to clip space, it is however
	 * not used for OpenGL or D3D since transformation to camera space
	 * and to clip space are handled by separate matrices there.
	 * On these platforms the two matrices are built in the platform's
	 * beginUpdate function.
	 * On the PS2 the z- and w-rows are the same and the 
	 * 1/2 translation/shear is removed again on the VU1 by
	 * subtracting the w-row/2 from the x- and y-rows.
	 *
	 * perspective:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        0        1
	 *
	 * RW builds this matrix directly without using explicit
	 * inversion and matrix multiplication.
	 */

	Camera *cam = (Camera*)obj;
	Matrix inv, proj;
	Matrix::invertOrthonormal(&inv, cam->getFrame()->getLTM());

	inv.right.x = -inv.right.x;
	inv.up.x = -inv.up.x;
	inv.at.x = -inv.at.x;
	inv.pos.x = -inv.pos.x;

	float32 xscl = 1.0f/(2.0f*cam->viewWindow.x);
	float32 yscl = 1.0f/(2.0f*cam->viewWindow.y);

	proj.flags = 0;
	proj.right.x = xscl;
	proj.right.y = 0.0f;
	proj.right.z = 0.0f;

	proj.up.x = 0.0f;
	proj.up.y = -yscl;
	proj.up.z = 0.0f;

	if(cam->projection == Camera::PERSPECTIVE){
		proj.pos.x = -cam->viewOffset.x*xscl;
		proj.pos.y = cam->viewOffset.y*yscl;
		proj.pos.z = 0.0f;

		proj.at.x = -proj.pos.x + 0.5f;
		proj.at.y = -proj.pos.y + 0.5f;
		proj.at.z = 1.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipPersp(cam);
	}else{
		proj.at.x = cam->viewOffset.x*xscl;
		proj.at.y = -cam->viewOffset.y*yscl;
		proj.at.z = 1.0f;

		proj.pos.x = -proj.at.x + 0.5f;
		proj.pos.y = -proj.at.y + 0.5f;
		proj.pos.z = 0.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipParallel(cam);
	}
	cam->frustumBoundBox.calculate(cam->frustumCorners, 8);
}